

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool ppk_loadpub_s(BinarySource *src,char **algorithm,BinarySink *bs,char **commentptr,
                   char **errorstr)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  ssh_keyalg *psVar11;
  uint *data;
  void *pvVar12;
  char *pcVar13;
  size_t sVar14;
  strbuf *buf_o;
  char cVar15;
  long lVar16;
  ulong uVar17;
  uint8_t *p_1;
  char *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ptrlen pVar27;
  char header [40];
  char *local_a8;
  char *local_a0;
  char *local_98;
  char local_68 [4];
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char cStack_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  uchar local_33 [3];
  
  iVar6 = key_type_s(src);
  if (iVar6 == 3) {
    _Var5 = read_header(src,local_68);
    if ((!_Var5) ||
       (((auVar22[0] = -(cStack_62 == 'U'), auVar22[1] = -(cStack_61 == 's'),
         auVar22[2] = -(cStack_60 == 'e'), auVar22[3] = -(cStack_5f == 'r'),
         auVar22[4] = -(cStack_5e == '-'), auVar22[5] = -(cStack_5d == 'K'),
         auVar22[6] = -(cStack_5c == 'e'), auVar22[7] = -(cStack_5b == 'y'),
         auVar22[8] = -(cStack_5a == '-'), auVar22[9] = -(cStack_59 == 'F'),
         auVar22[10] = -(cStack_58 == 'i'), auVar22[0xb] = -(cStack_57 == 'l'),
         auVar22[0xc] = -(cStack_56 == 'e'), auVar22[0xd] = -(cStack_55 == '-'),
         auVar22[0xe] = -(cStack_54 == '3'), auVar22[0xf] = -(cStack_53 == '\0'),
         auVar25[0] = -(local_68[0] == 'P'), auVar25[1] = -(local_68[1] == 'u'),
         auVar25[2] = -(local_68[2] == 'T'), auVar25[3] = -(local_68[3] == 'T'),
         auVar25[4] = -(cStack_64 == 'Y'), auVar25[5] = -(cStack_63 == '-'),
         auVar25[6] = -(cStack_62 == 'U'), auVar25[7] = -(cStack_61 == 's'),
         auVar25[8] = -(cStack_60 == 'e'), auVar25[9] = -(cStack_5f == 'r'),
         auVar25[10] = -(cStack_5e == '-'), auVar25[0xb] = -(cStack_5d == 'K'),
         auVar25[0xc] = -(cStack_5c == 'e'), auVar25[0xd] = -(cStack_5b == 'y'),
         auVar25[0xe] = -(cStack_5a == '-'), auVar25[0xf] = -(cStack_59 == 'F'),
         auVar22 = auVar22 & auVar25,
         (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff &&
         (auVar23[0] = -(cStack_62 == 'U'), auVar23[1] = -(cStack_61 == 's'),
         auVar23[2] = -(cStack_60 == 'e'), auVar23[3] = -(cStack_5f == 'r'),
         auVar23[4] = -(cStack_5e == '-'), auVar23[5] = -(cStack_5d == 'K'),
         auVar23[6] = -(cStack_5c == 'e'), auVar23[7] = -(cStack_5b == 'y'),
         auVar23[8] = -(cStack_5a == '-'), auVar23[9] = -(cStack_59 == 'F'),
         auVar23[10] = -(cStack_58 == 'i'), auVar23[0xb] = -(cStack_57 == 'l'),
         auVar23[0xc] = -(cStack_56 == 'e'), auVar23[0xd] = -(cStack_55 == '-'),
         auVar23[0xe] = -(cStack_54 == '2'), auVar23[0xf] = -(cStack_53 == '\0'),
         auVar26[0] = -(local_68[0] == 'P'), auVar26[1] = -(local_68[1] == 'u'),
         auVar26[2] = -(local_68[2] == 'T'), auVar26[3] = -(local_68[3] == 'T'),
         auVar26[4] = -(cStack_64 == 'Y'), auVar26[5] = -(cStack_63 == '-'),
         auVar26[6] = -(cStack_62 == 'U'), auVar26[7] = -(cStack_61 == 's'),
         auVar26[8] = -(cStack_60 == 'e'), auVar26[9] = -(cStack_5f == 'r'),
         auVar26[10] = -(cStack_5e == '-'), auVar26[0xb] = -(cStack_5d == 'K'),
         auVar26[0xc] = -(cStack_5c == 'e'), auVar26[0xd] = -(cStack_5b == 'y'),
         auVar26[0xe] = -(cStack_5a == '-'), auVar26[0xf] = -(cStack_59 == 'F'),
         auVar23 = auVar23 & auVar26,
         (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff)) &&
        (auVar21[0] = -(local_68[0] == 'P'), auVar21[1] = -(local_68[1] == 'u'),
        auVar21[2] = -(local_68[2] == 'T'), auVar21[3] = -(local_68[3] == 'T'),
        auVar21[4] = -(cStack_64 == 'Y'), auVar21[5] = -(cStack_63 == '-'),
        auVar21[6] = -(cStack_62 == 'U'), auVar21[7] = -(cStack_61 == 's'),
        auVar21[8] = -(cStack_60 == 'e'), auVar21[9] = -(cStack_5f == 'r'),
        auVar21[10] = -(cStack_5e == '-'), auVar21[0xb] = -(cStack_5d == 'K'),
        auVar21[0xc] = -(cStack_5c == 'e'), auVar21[0xd] = -(cStack_5b == 'y'),
        auVar21[0xe] = -(cStack_5a == '-'), auVar21[0xf] = -(cStack_59 == 'F'),
        auVar24[0] = -(cStack_62 == 'U'), auVar24[1] = -(cStack_61 == 's'),
        auVar24[2] = -(cStack_60 == 'e'), auVar24[3] = -(cStack_5f == 'r'),
        auVar24[4] = -(cStack_5e == '-'), auVar24[5] = -(cStack_5d == 'K'),
        auVar24[6] = -(cStack_5c == 'e'), auVar24[7] = -(cStack_5b == 'y'),
        auVar24[8] = -(cStack_5a == '-'), auVar24[9] = -(cStack_59 == 'F'),
        auVar24[10] = -(cStack_58 == 'i'), auVar24[0xb] = -(cStack_57 == 'l'),
        auVar24[0xc] = -(cStack_56 == 'e'), auVar24[0xd] = -(cStack_55 == '-'),
        auVar24[0xe] = -(cStack_54 == '1'), auVar24[0xf] = -(cStack_53 == '\0'),
        auVar24 = auVar24 & auVar21,
        (ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff)))) {
      auVar19[0] = -(local_68[0] == 'P');
      auVar19[1] = -(local_68[1] == 'u');
      auVar19[2] = -(local_68[2] == 'T');
      auVar19[3] = -(local_68[3] == 'T');
      auVar19[4] = -(cStack_64 == 'Y');
      auVar19[5] = -(cStack_63 == '-');
      auVar19[6] = -(cStack_62 == 'U');
      auVar19[7] = -(cStack_61 == 's');
      auVar19[8] = -(cStack_60 == 'e');
      auVar19[9] = -(cStack_5f == 'r');
      auVar19[10] = -(cStack_5e == '-');
      auVar19[0xb] = -(cStack_5d == 'K');
      auVar19[0xc] = -(cStack_5c == 'e');
      auVar19[0xd] = -(cStack_5b == 'y');
      auVar19[0xe] = -(cStack_5a == '-');
      auVar19[0xf] = -(cStack_59 == 'F');
      auVar20[0] = -(cStack_58 == 'i');
      auVar20[1] = -(cStack_57 == 'l');
      auVar20[2] = -(cStack_56 == 'e');
      auVar20[3] = -(cStack_55 == '-');
      auVar20[4] = 0xff;
      auVar20[5] = 0xff;
      auVar20[6] = 0xff;
      auVar20[7] = 0xff;
      auVar20[8] = 0xff;
      auVar20[9] = 0xff;
      auVar20[10] = 0xff;
      auVar20[0xb] = 0xff;
      auVar20[0xc] = 0xff;
      auVar20[0xd] = 0xff;
      auVar20[0xe] = 0xff;
      auVar20[0xf] = 0xff;
      auVar20 = auVar20 & auVar19;
      pcVar9 = "not a public key or a PuTTY SSH-2 private key";
      if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
        pcVar9 = "PuTTY key format too new";
      }
      pcVar13 = (char *)0x0;
      goto LAB_001110c0;
    }
    pcVar13 = read_body(src);
    pcVar9 = "file format error";
    if (pcVar13 != (char *)0x0) {
      psVar11 = find_pubkey_alg(pcVar13);
      safefree(pcVar13);
      if (((psVar11 != (ssh_keyalg *)0x0) && (_Var5 = read_header(src,local_68), _Var5)) &&
         ((CONCAT17(cStack_5e,
                    CONCAT16(cStack_5f,
                             CONCAT15(cStack_60,
                                      CONCAT14(cStack_61,
                                               CONCAT13(cStack_62,
                                                        CONCAT12(cStack_63,
                                                                 CONCAT11(cStack_64,local_68[3])))))
                            )) == 0x6e6f6974707972 &&
           CONCAT17(cStack_61,
                    CONCAT16(cStack_62,
                             CONCAT15(cStack_63,
                                      CONCAT14(cStack_64,
                                               CONCAT13(local_68[3],
                                                        CONCAT12(local_68[2],
                                                                 CONCAT11(local_68[1],local_68[0])))
                                              )))) == 0x6974707972636e45 &&
          (pcVar13 = read_body(src), pcVar13 != (char *)0x0)))) {
        safefree(pcVar13);
        _Var5 = read_header(src,local_68);
        pcVar13 = (char *)0x0;
        if ((!_Var5) ||
           (CONCAT17(cStack_61,
                     CONCAT16(cStack_62,
                              CONCAT15(cStack_63,
                                       CONCAT14(cStack_64,
                                                CONCAT13(local_68[3],
                                                         CONCAT12(local_68[2],
                                                                  CONCAT11(local_68[1],local_68[0]))
                                                        ))))) != 0x746e656d6d6f43))
        goto LAB_001110c0;
        pcVar13 = read_body(src);
        if (pcVar13 != (char *)0x0) {
          if (commentptr == (char **)0x0) {
            safefree(pcVar13);
          }
          else {
            *commentptr = pcVar13;
          }
          _Var5 = read_header(src,local_68);
          if (((_Var5) &&
              (CONCAT17(cStack_5c,
                        CONCAT16(cStack_5d,
                                 CONCAT15(cStack_5e,
                                          CONCAT14(cStack_5f,
                                                   CONCAT13(cStack_60,
                                                            CONCAT12(cStack_61,
                                                                     CONCAT11(cStack_62,cStack_63)))
                                                  )))) == 0x73656e694c2d63 &&
               CONCAT17(cStack_61,
                        CONCAT16(cStack_62,
                                 CONCAT15(cStack_63,
                                          CONCAT14(cStack_64,
                                                   CONCAT13(local_68[3],
                                                            CONCAT12(local_68[2],
                                                                     CONCAT11(local_68[1],
                                                                              local_68[0]))))))) ==
               0x4c2d63696c627550)) && (pcVar18 = read_body(src), pcVar18 != (char *)0x0)) {
            iVar6 = userkey_parse_line_counter(pcVar18);
            safefree(pcVar18);
            if ((-1 < iVar6) && (_Var5 = read_blob(src,iVar6,bs), _Var5)) {
              if (algorithm != (char **)0x0) {
                pcVar9 = dupstr(psVar11->ssh_id);
                *algorithm = pcVar9;
                return true;
              }
              return true;
            }
          }
          goto LAB_001110c0;
        }
      }
    }
  }
  else {
    if (iVar6 == 10) {
      pVar27 = BinarySource_get_chomped_line(src->binarysource_);
      pcVar9 = mkstr(pVar27);
      pcVar13 = strchr(pcVar9,0x20);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "no key blob in OpenSSH public key file";
        data = (uint *)0x0;
        local_a8 = (char *)0x0;
      }
      else {
        pcVar18 = pcVar13 + 1;
        *pcVar13 = '\0';
        pcVar10 = strchr(pcVar18,0x20);
        iVar6 = 0;
        if (pcVar10 == (char *)0x0) {
          local_a8 = (char *)0x0;
        }
        else {
          *pcVar10 = '\0';
          local_a8 = dupstr(pcVar10 + 1);
        }
        sVar14 = strlen(pcVar18);
        iVar3 = (int)(sVar14 >> 2);
        iVar8 = iVar3 * 3;
        data = (uint *)safemalloc((long)iVar8,1,0);
        pvVar12 = memchr(pcVar18,0,4);
        if (pvVar12 == (void *)0x0) {
          iVar6 = 0;
          pcVar13 = pcVar13 + 5;
          do {
            pcVar18 = pcVar13;
            iVar7 = iVar6 + 3;
            if (iVar7 != iVar8 && SBORROW4(iVar7,iVar8) == iVar7 + iVar3 * -3 < 0) {
              __assert_fail("pubbloblen + 3 <= pubblobsize",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c"
                            ,0x4a0,
                            "_Bool openssh_loadpub(BinarySource *, char **, BinarySink *, char **, const char **)"
                           );
            }
            iVar7 = base64_decode_atom(pcVar18 + -4,(uchar *)((long)iVar6 + (long)data));
            iVar6 = iVar6 + iVar7;
            pvVar12 = memchr(pcVar18,0,4);
            pcVar13 = pcVar18 + 4;
          } while (pvVar12 == (void *)0x0);
        }
        if (*pcVar18 == '\0') {
          sVar14 = strlen(pcVar9);
          uVar4 = (uint)sVar14;
          pcVar13 = "key algorithms do not match in OpenSSH public key file";
          if ((((int)(uVar4 + 4) <= iVar6) &&
              (uVar1 = *data,
              (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ==
              uVar4)) && (iVar8 = bcmp(data + 1,pcVar9,(long)(int)uVar4), iVar8 == 0)) {
            if (algorithm != (char **)0x0) {
              pcVar13 = dupstr(pcVar9);
              *algorithm = pcVar13;
            }
            if (commentptr == (char **)0x0) {
              safefree(local_a8);
            }
            else {
              *commentptr = local_a8;
            }
            safefree(pcVar9);
            BinarySink_put_data(bs->binarysink_,data,(long)iVar6);
            safefree(data);
            return true;
          }
        }
        else {
          pcVar13 = "invalid length for base64 data in OpenSSH public key file";
        }
      }
      safefree(pcVar9);
      safefree(local_a8);
      safefree(data);
      if (errorstr == (char **)0x0) {
        return false;
      }
      *errorstr = pcVar13;
      return false;
    }
    if (iVar6 == 9) {
      pVar27 = BinarySource_get_chomped_line(src->binarysource_);
      pcVar9 = mkstr(pVar27);
      local_a0 = "invalid begin line in SSH-2 public key file";
      if (pcVar9 != (char *)0x0) {
        iVar6 = strcmp(pcVar9,"---- BEGIN SSH2 PUBLIC KEY ----");
        if (iVar6 != 0) {
          buf_o = (strbuf *)0x0;
          local_98 = (char *)0x0;
          goto LAB_0011155c;
        }
        safefree(pcVar9);
        pVar27 = BinarySource_get_chomped_line(src->binarysource_);
        pcVar9 = mkstr(pVar27);
        local_a0 = "truncated SSH-2 public key file";
        if (pcVar9 != (char *)0x0) {
          local_98 = (char *)0x0;
LAB_001112d3:
          pcVar13 = strstr(pcVar9,": ");
          if (pcVar13 == (char *)0x0) {
            buf_o = strbuf_new();
            local_a0 = "invalid end line in SSH-2 public key file";
            iVar6 = 0;
            goto LAB_00111484;
          }
          *pcVar13 = '\0';
          iVar6 = strcmp(pcVar9,"Comment");
          if (iVar6 == 0) {
            pcVar18 = pcVar13 + 2;
            pcVar10 = pcVar9;
            if ((*pcVar18 == '\"') && (sVar14 = strlen(pcVar18), pcVar13[sVar14 + 1] == '\"')) {
              pcVar13[sVar14 + 1] = '\0';
              pcVar18 = pcVar13 + 3;
            }
            do {
              cVar15 = *pcVar18;
              if (cVar15 == '\\') {
                pcVar13 = pcVar18 + 1;
                cVar15 = pcVar18[1];
                if (cVar15 == '\0') {
                  cVar15 = '\\';
                  pcVar13 = pcVar18;
                }
              }
              else {
                pcVar13 = pcVar18;
                if (cVar15 == '\0') goto LAB_00111388;
              }
              *pcVar10 = cVar15;
              pcVar18 = pcVar13 + 1;
              pcVar10 = pcVar10 + 1;
            } while( true );
          }
          iVar6 = strcmp(pcVar9,"Subject");
          if ((iVar6 == 0) || ((*pcVar9 == 'x' && (pcVar9[1] == '-')))) goto LAB_001113a6;
          local_a0 = "unrecognised header in SSH-2 public key file";
          goto LAB_0011150d;
        }
      }
      buf_o = (strbuf *)0x0;
      local_98 = (char *)0x0;
LAB_001113dc:
      pcVar9 = (char *)0x0;
      goto LAB_0011155c;
    }
    pcVar9 = "not a public key or a PuTTY SSH-2 private key";
  }
  pcVar13 = (char *)0x0;
LAB_001110c0:
  if (errorstr != (char **)0x0) {
    *errorstr = pcVar9;
  }
  if (commentptr == (char **)0x0 || pcVar13 == (char *)0x0) {
    return false;
  }
  safefree(pcVar13);
  *commentptr = (char *)0x0;
  return false;
LAB_00111388:
  *pcVar10 = '\0';
  safefree(local_98);
  local_98 = dupstr(pcVar9);
LAB_001113a6:
  safefree(pcVar9);
  pVar27 = BinarySource_get_chomped_line(src->binarysource_);
  pcVar9 = mkstr(pVar27);
  if (pcVar9 == (char *)0x0) goto code_r0x001113ce;
  goto LAB_001112d3;
code_r0x001113ce:
  pcVar9 = (char *)0x0;
LAB_0011150d:
  buf_o = (strbuf *)0x0;
  goto LAB_0011155c;
LAB_00111484:
  do {
    cVar15 = *pcVar9;
    if (cVar15 != '\0') {
      pcVar13 = pcVar9;
      if (cVar15 == '-') {
        iVar6 = strcmp(pcVar9,"---- END SSH2 PUBLIC KEY ----");
        if (iVar6 != 0) goto LAB_0011155c;
        safefree(pcVar9);
        if (3 < buf_o->len) {
          pbVar2 = buf_o->u;
          pcVar9 = (char *)0x0;
          local_a0 = "invalid algorithm prefix in SSH-2 public key file";
          if ((-1 < (int)((uint)*pbVar2 << 0x18)) &&
             (uVar17 = (ulong)CONCAT13(*pbVar2,CONCAT12(pbVar2[1],
                                                        *(ushort *)(pbVar2 + 2) << 8 |
                                                        *(ushort *)(pbVar2 + 2) >> 8)),
             uVar17 <= buf_o->len - 4)) {
            if (algorithm != (char **)0x0) {
              pcVar9 = dupprintf("%.*s",uVar17,buf_o->s + 4);
              *algorithm = pcVar9;
            }
            if (commentptr == (char **)0x0) {
              safefree(local_98);
            }
            else {
              *commentptr = local_98;
            }
            pVar27.ptr = buf_o->u;
            pVar27.len = buf_o->len;
            BinarySink_put_datapl(bs->binarysink_,pVar27);
            strbuf_free(buf_o);
            return true;
          }
          goto LAB_0011155c;
        }
        local_a0 = "not enough data in SSH-2 public key file";
        goto LAB_001113dc;
      }
      do {
        lVar16 = (long)iVar6;
        iVar6 = iVar6 + 1;
        local_68[lVar16] = cVar15;
        if (iVar6 == 4) {
          iVar6 = base64_decode_atom(local_68,local_33);
          BinarySink_put_data(buf_o->binarysink_,local_33,(long)iVar6);
          iVar6 = 0;
        }
        cVar15 = pcVar13[1];
        pcVar13 = pcVar13 + 1;
      } while (cVar15 != '\0');
    }
    safefree(pcVar9);
    pVar27 = BinarySource_get_chomped_line(src->binarysource_);
    pcVar9 = mkstr(pVar27);
  } while (pcVar9 != (char *)0x0);
  pcVar9 = (char *)0x0;
LAB_0011155c:
  safefree(pcVar9);
  safefree(local_98);
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  if (errorstr != (char **)0x0) {
    *errorstr = local_a0;
  }
  return false;
}

Assistant:

bool ppk_loadpub_s(BinarySource *src, char **algorithm, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    char header[40], *b;
    const ssh_keyalg *alg;
    int type, i;
    const char *error = NULL;
    char *comment = NULL;

    /* Initially, check if this is a public-only key file. Sometimes
     * we'll be asked to read a public blob from one of those. */
    type = key_type_s(src);
    if (type == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        bool ret = rfc4716_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        bool ret = openssh_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type != SSH_KEYTYPE_SSH2) {
        error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        if (0 == strncmp(header, "PuTTY-User-Key-File-", 20))
            error = "PuTTY key format too new";
        else
            error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    sfree(b);
    if (!alg) {
        goto error;
    }

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    sfree(b);                          /* we don't care */

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    if (!read_blob(src, i, bs))
        goto error;

    if (algorithm)
        *algorithm = dupstr(alg->ssh_id);
    return true;

    /*
     * Error processing.
     */
  error:
    if (errorstr)
        *errorstr = error;
    if (comment && commentptr) {
        sfree(comment);
        *commentptr = NULL;
    }
    return false;
}